

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_window_quantiles.cc
# Opt level: O2

void __thiscall
prometheus::detail::TimeWindowQuantiles::TimeWindowQuantiles
          (TimeWindowQuantiles *this,
          vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
          *quantiles,duration max_age,int age_buckets)

{
  rep rVar1;
  allocator_type local_ff9;
  CKMSQuantiles local_ff8;
  
  this->quantiles_ = quantiles;
  CKMSQuantiles::CKMSQuantiles(&local_ff8,quantiles);
  std::vector<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
  ::vector(&this->ckms_quantiles_,(long)age_buckets,&local_ff8,&local_ff9);
  std::
  _Vector_base<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
  ::~_Vector_base(&local_ff8.sample_.
                   super__Vector_base<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
                 );
  this->current_bucket_ = 0;
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->last_rotation_).__d.__r = rVar1;
  (this->rotation_interval_).__r = max_age.__r / (long)age_buckets;
  return;
}

Assistant:

TimeWindowQuantiles::TimeWindowQuantiles(
    const std::vector<CKMSQuantiles::Quantile>& quantiles,
    const Clock::duration max_age, const int age_buckets)
    : quantiles_(quantiles),
      ckms_quantiles_(age_buckets, CKMSQuantiles(quantiles_)),
      current_bucket_(0),
      last_rotation_(Clock::now()),
      rotation_interval_(max_age / age_buckets) {}